

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

int map_insert(map m,map_key key,map_value value)

{
  int iVar1;
  bucket b_00;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  bucket b;
  size_t index;
  map_hash h;
  map in_stack_00000038;
  int local_4;
  
  if (((in_RDI == (long *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) {
    log_write_impl_va("metacall",0xc3,"map_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,3,"Invalid map insertion parameters");
    local_4 = 1;
  }
  else {
    b_00 = (bucket)(*(code *)in_RDI[4])(in_RSI);
    iVar1 = bucket_insert(b_00,(void *)((ulong)b_00 % (ulong)in_RDI[1]),
                          (void *)(in_RDI[3] + (long)((ulong)b_00 % (ulong)in_RDI[1]) * 0x18));
    if (iVar1 == 0) {
      *in_RDI = *in_RDI + 1;
      local_4 = map_bucket_realloc(in_stack_00000038);
    }
    else {
      log_write_impl_va("metacall",0xcf,"map_insert",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,3,"Invalid map bucket insertion");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int map_insert(map m, map_key key, map_value value)
{
	map_hash h;
	size_t index;
	bucket b;

	if (m == NULL || key == NULL || value == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map insertion parameters");
		return 1;
	}

	h = m->hash_cb(key);

	index = h % m->capacity;

	b = &m->buckets[index];

	if (bucket_insert(b, key, value) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket insertion");
		return 1;
	}

	++m->count;

	return map_bucket_realloc(m);
}